

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDComponentPtr __thiscall ON_SubD::FirstComponent(ON_SubD *this,Type component_type)

{
  element_type *peVar1;
  ON_SubDLevel *pOVar2;
  undefined3 in_register_00000031;
  int iVar3;
  
  iVar3 = CONCAT31(in_register_00000031,component_type);
  if (iVar3 == 6) {
    peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar2 = peVar1->m_active_level, pOVar2 == (ON_SubDLevel *)0x0)) {
      pOVar2 = &ON_SubDLevel::Empty;
    }
    if (pOVar2->m_face[0] != (ON_SubDFace *)0x0) {
      return (ON_SubDComponentPtr)((ulong)pOVar2->m_face[0] | 6);
    }
  }
  else if (iVar3 == 4) {
    peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar2 = peVar1->m_active_level, pOVar2 == (ON_SubDLevel *)0x0)) {
      pOVar2 = &ON_SubDLevel::Empty;
    }
    if (pOVar2->m_edge[0] != (ON_SubDEdge *)0x0) {
      return (ON_SubDComponentPtr)((ulong)pOVar2->m_edge[0] | 4);
    }
  }
  else if (iVar3 == 2) {
    peVar1 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if ((peVar1 == (element_type *)0x0) ||
       (pOVar2 = peVar1->m_active_level, pOVar2 == (ON_SubDLevel *)0x0)) {
      pOVar2 = &ON_SubDLevel::Empty;
    }
    if (pOVar2->m_vertex[0] != (ON_SubDVertex *)0x0) {
      return (ON_SubDComponentPtr)((ulong)pOVar2->m_vertex[0] | 2);
    }
  }
  return (ON_SubDComponentPtr)0;
}

Assistant:

const ON_SubDComponentPtr ON_SubD::FirstComponent(
  ON_SubDComponentPtr::Type component_type
) const
{
  switch (component_type)
  {
  case ON_SubDComponentPtr::Type::Vertex:
    return ON_SubDComponentPtr::Create(this->FirstVertex());
    break;
  case ON_SubDComponentPtr::Type::Edge:
    return ON_SubDComponentPtr::Create(this->FirstEdge());
    break;
  case ON_SubDComponentPtr::Type::Face:
    return ON_SubDComponentPtr::Create(this->FirstFace());
    break;
  default:
    break;
  }
  return ON_SubDComponentPtr::Null;
}